

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_scene_details.cxx
# Opt level: O1

void __thiscall xray_re::xr_scene_details::save(xr_scene_details *this,xr_writer *w)

{
  pointer ppdVar1;
  pointer ppcVar2;
  pointer pbVar3;
  xr_scene_details *pxVar4;
  pointer ppcVar5;
  pointer ppdVar6;
  uint32_t id;
  pointer value;
  write_detail local_43;
  undefined1 local_42;
  write_color_index local_41;
  xr_scene_details *local_40;
  uint32_t local_38;
  undefined4 local_34;
  
  xr_scene_revision::save(&(this->super_xr_scene_part).m_revision,w);
  xr_writer::w_raw_chunk(w,0x1000,&DETMGR_VERSION,4,false);
  xr_writer::w_raw_chunk(w,0x1006,&this->m_flags,4,false);
  xr_writer::open_chunk(w,0);
  details_header::save(&this->m_header,w);
  xr_writer::close_chunk(w);
  xr_writer::open_chunk(w,1);
  ppdVar6 = (this->m_objects).
            super__Vector_base<xray_re::detail_object_*,_std::allocator<xray_re::detail_object_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppdVar1 = (this->m_objects).
            super__Vector_base<xray_re::detail_object_*,_std::allocator<xray_re::detail_object_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  local_40 = this;
  if (ppdVar6 != ppdVar1) {
    id = 0;
    do {
      xr_writer::open_chunk(w,id);
      write_detail::operator()(&local_43,*ppdVar6,w);
      xr_writer::close_chunk(w);
      ppdVar6 = ppdVar6 + 1;
      id = id + 1;
    } while (ppdVar6 != ppdVar1);
  }
  xr_writer::close_chunk(w);
  xr_writer::open_chunk(w,0x1003);
  pxVar4 = local_40;
  local_42 = (undefined1)
             ((uint)(*(int *)&(local_40->m_indices).
                              super__Vector_base<xray_re::color_index_*,_std::allocator<xray_re::color_index_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                    *(int *)&(local_40->m_indices).
                             super__Vector_base<xray_re::color_index_*,_std::allocator<xray_re::color_index_*>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 3);
  (*w->_vptr_xr_writer[2])(w,&local_42,1);
  ppcVar5 = (pxVar4->m_indices).
            super__Vector_base<xray_re::color_index_*,_std::allocator<xray_re::color_index_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppcVar2 = (pxVar4->m_indices).
            super__Vector_base<xray_re::color_index_*,_std::allocator<xray_re::color_index_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if (ppcVar5 != ppcVar2) {
    do {
      write_color_index::operator()(&local_41,*ppcVar5,w);
      ppcVar5 = ppcVar5 + 1;
    } while (ppcVar5 != ppcVar2);
  }
  xr_writer::close_chunk(w);
  xr_writer::open_chunk(w,2);
  local_38 = pxVar4->m_num_slots;
  (*w->_vptr_xr_writer[2])(w,&local_38,4);
  if ((ulong)pxVar4->m_num_slots != 0) {
    (*w->_vptr_xr_writer[2])(w,pxVar4->m_slots,(ulong)pxVar4->m_num_slots << 4);
  }
  xr_writer::close_chunk(w);
  xr_writer::w_raw_chunk(w,0x1001,&pxVar4->m_bbox,0x18,false);
  if ((pxVar4->m_texture)._M_string_length != 0) {
    xr_writer::open_chunk(w,0x1002);
    xr_writer::w_sz(w,&pxVar4->m_texture);
    xr_writer::close_chunk(w);
  }
  xr_writer::w_raw_chunk(w,0x1005,&pxVar4->m_density,4,false);
  xr_writer::open_chunk(w,0x1004);
  local_34 = (undefined4)
             ((ulong)((long)(pxVar4->m_snap_objects).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(pxVar4->m_snap_objects).
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start) >> 5);
  (*w->_vptr_xr_writer[2])(w,&local_34,4);
  pbVar3 = (pxVar4->m_snap_objects).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (value = (pxVar4->m_snap_objects).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start; value != pbVar3; value = value + 1) {
    xr_writer::w_sz(w,value);
  }
  xr_writer::close_chunk(w);
  return;
}

Assistant:

void xr_scene_details::save(xr_writer& w) const
{
	revision().save(w);
	w.w_chunk<uint32_t>(DETMGR_CHUNK_VERSION, DETMGR_VERSION);
	w.w_chunk<uint32_t>(DETMGR_CHUNK_FLAGS, m_flags);

// this is ignored in LE
//	m_header.object_count = uint32_t(m_objects.size() & UINT32_MAX);
	w.open_chunk(DETMGR_CHUNK_HEADER);
	m_header.save(w);
	w.close_chunk();

	w.open_chunk(DETMGR_CHUNK_OBJECTS);
	w.w_chunks(m_objects, write_detail());
	w.close_chunk();

	w.open_chunk(DETMGR_CHUNK_COLOR_INDEX);
	w.w_size_u8(m_indices.size());
	w.w_seq(m_indices, write_color_index());
	w.close_chunk();

	w.open_chunk(DETMGR_CHUNK_SLOTS);
	w.w_u32(m_num_slots);
	w.w_cseq(m_num_slots, m_slots);
	w.close_chunk();

	w.w_chunk(DETMGR_CHUNK_BBOX, m_bbox);

	if (!m_texture.empty())
		w.w_chunk(DETMGR_CHUNK_TEXTURE, m_texture);

	w.w_chunk(DETMGR_CHUNK_DENSITY, m_density);

	w.open_chunk(DETMGR_CHUNK_SNAP_OBJECTS);
	w.w_size_u32(m_snap_objects.size());
	w.w_seq(m_snap_objects, xr_writer::f_w_sz());
	w.close_chunk();
}